

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmt_tests.cpp
# Opt level: O3

void __thiscall pmt_tests::pmt_malleability::test_method(pmt_malleability *this)

{
  void *pvVar1;
  CPartialMerkleTree *pCVar2;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  initializer_list<uint256> __l;
  initializer_list<bool> __l_00;
  const_string file;
  const_string msg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vTxid;
  char *local_280;
  char *local_278;
  lazy_ostream local_270;
  undefined1 *local_260;
  char **local_258;
  assertion_result local_250;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  vector<uint256,_std::allocator<uint256>_> local_200;
  vector<bool,_std::allocator<bool>_> local_1e8;
  uint256 local_1c0;
  CPartialMerkleTree local_1a0 [4];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_1a0,&DAT_00e98520,0x180);
  __l._M_len = 0xc;
  __l._M_array = (iterator)local_1a0;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            (&local_200,__l,(allocator_type *)&local_1e8);
  local_1a0[0].nTransactions = 0;
  local_1a0[0]._4_4_ = 0;
  local_1a0[0].vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._0_4_ = 0x10100;
  __l_00._M_len = 0xc;
  __l_00._M_array = (iterator)local_1a0;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_1e8,__l_00,(allocator_type *)&local_1c0);
  CPartialMerkleTree::CPartialMerkleTree(local_1a0,&local_200,&local_1e8);
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x7d;
  file.m_begin = (iterator)&local_228;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_238,msg);
  CPartialMerkleTree::ExtractMatches(&local_1c0,local_1a0,&local_200,&local_218);
  pCVar2 = (CPartialMerkleTree *)
           std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (&local_1c0,local_1a0);
  local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar2 == local_1a0);
  local_250.m_message.px = (element_type *)0x0;
  local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258 = &local_280;
  local_280 = "tree.ExtractMatches(vTxid, vIndex).IsNull()";
  local_278 = "";
  local_270.m_empty = false;
  local_270._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_260 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_250,&local_270,1,0,WARN,0xe983bc,(size_t)&stack0xfffffffffffffd70,0x7d);
  boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
  if (local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a0[0].vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0[0].vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_1a0[0].vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0[0].vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pvVar1 = (void *)CONCAT44(local_1a0[0].vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                            local_1a0[0].vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_1a0[0].vBits.super__Bvector_base<std::allocator<bool>_>.
                                 _M_impl.super__Bvector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if (local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
  }
  if (local_200.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_200.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(pmt_malleability)
{
    std::vector<uint256> vTxid{
        uint256{1}, uint256{2},
        uint256{3}, uint256{4},
        uint256{5}, uint256{6},
        uint256{7}, uint256{8},
        uint256{9}, uint256{10},
        uint256{9}, uint256{10},
    };
    std::vector<bool> vMatch = {false, false, false, false, false, false, false, false, false, true, true, false};

    CPartialMerkleTree tree(vTxid, vMatch);
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(tree.ExtractMatches(vTxid, vIndex).IsNull());
}